

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  reference ppcVar1;
  memory_buf_t *pmVar2;
  const_reference ppcVar3;
  size_t sVar4;
  scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff48;
  char *pcVar5;
  array<const_char_*,_7UL> *in_stack_ffffffffffffff50;
  scoped_padder *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  memory_buf_t *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff74;
  memory_buf_t *in_stack_ffffffffffffff78;
  undefined4 uVar7;
  int n;
  int in_stack_ffffffffffffff8c;
  
  scoped_padder::scoped_padder
            ((scoped_padder *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,(padding_info *)in_stack_ffffffffffffff60,
             (memory_buf_t *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,
                               CONCAT15(in_stack_ffffffffffffff5d,
                                        CONCAT14(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                )))));
  ppcVar1 = std::array<const_char_*,_7UL>::operator[]
                      (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  pcVar5 = *ppcVar1;
  this_00 = (scoped_padder *)&stack0xffffffffffffff80;
  n = (int)((ulong)pcVar5 >> 0x20);
  uVar7 = SUB84(pcVar5,0);
  pmVar2 = (memory_buf_t *)strlen(pcVar5);
  this_00->dest_ = pmVar2;
  view.size_._0_4_ = in_stack_ffffffffffffff70;
  view.data_ = (char *)in_stack_ffffffffffffff68;
  view.size_._4_4_ = in_stack_ffffffffffffff74;
  fmt_helper::append_string_view(view,in_stack_ffffffffffffff60);
  uVar6 = CONCAT13(0x20,(int3)in_stack_ffffffffffffff70);
  ::fmt::v8::detail::buffer<char>::push_back((buffer<char> *)this_00,in_stack_ffffffffffffff48);
  ppcVar3 = std::array<const_char_*,_12UL>::operator[]
                      ((array<const_char_*,_12UL> *)this_00,(size_type)in_stack_ffffffffffffff48);
  pmVar2 = (memory_buf_t *)*ppcVar3;
  pcVar5 = &stack0xffffffffffffff60;
  sVar4 = strlen((char *)pmVar2);
  *(size_t *)(pcVar5 + 8) = sVar4;
  view_00.size_._0_4_ = uVar6;
  view_00.data_ = (char *)in_stack_ffffffffffffff68;
  view_00.size_._4_4_ = in_stack_ffffffffffffff74;
  fmt_helper::append_string_view(view_00,pmVar2);
  ::fmt::v8::detail::buffer<char>::push_back((buffer<char> *)this_00,pcVar5);
  fmt_helper::append_int<int>(n,in_stack_ffffffffffffff78);
  ::fmt::v8::detail::buffer<char>::push_back((buffer<char> *)this_00,pcVar5);
  fmt_helper::pad2(in_stack_ffffffffffffff8c,(memory_buf_t *)CONCAT44(n,uVar7));
  ::fmt::v8::detail::buffer<char>::push_back((buffer<char> *)this_00,pcVar5);
  fmt_helper::pad2(in_stack_ffffffffffffff8c,(memory_buf_t *)CONCAT44(n,uVar7));
  ::fmt::v8::detail::buffer<char>::push_back((buffer<char> *)this_00,pcVar5);
  fmt_helper::pad2(in_stack_ffffffffffffff8c,(memory_buf_t *)CONCAT44(n,uVar7));
  ::fmt::v8::detail::buffer<char>::push_back((buffer<char> *)this_00,pcVar5);
  fmt_helper::append_int<int>(n,in_stack_ffffffffffffff78);
  scoped_padder::~scoped_padder(this_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }